

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliffs.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  char *pcVar4;
  int baud;
  undefined4 local_1bc;
  RobotModel model;
  string port;
  Create robot;
  
  _model = create::RobotModel::CREATE_2;
  std::__cxx11::string::string((string *)&port,"/dev/ttyUSB0",(allocator *)&robot);
  pcVar4 = "Running driver for Create 2";
  if (1 < argc) {
    std::__cxx11::string::string((string *)&robot,argv[1],(allocator *)&local_1bc);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &robot,"create1");
    std::__cxx11::string::~string((string *)&robot);
    if (bVar1) {
      _model = create::RobotModel::CREATE_1;
      pcVar4 = "Running driver for Create 1";
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  create::Create::Create(&robot,1);
  cVar2 = create::Create::connect((string *)&robot,(int *)&port);
  if (cVar2 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"Failed to connect to robot on port ");
    poVar3 = std::operator<<(poVar3,port._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar3);
    create::Create::~Create(&robot);
    std::__cxx11::string::~string((string *)&port);
    return 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Connected to robot");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_1bc = 3;
  create::Create::setMode((CreateMode *)&robot);
  do {
    create::Create::isCliffLeft();
    create::Create::isCliffFrontLeft();
    create::Create::isCliffFrontRight();
    create::Create::isCliffRight();
    poVar3 = std::operator<<((ostream *)&std::cout,"\rCliffs (left to right): [ ");
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    std::operator<<(poVar3," ]");
    usleep(10000);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud)) {
    std::cout << "Connected to robot" << std::endl;
  }
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  while (true) {
    // Get cliff status
    const bool cliff_left = robot.isCliffLeft();
    const bool cliff_front_left = robot.isCliffFrontLeft();
    const bool cliff_front_right = robot.isCliffFrontRight();
    const bool cliff_right = robot.isCliffRight();

    // Print status
    std::cout << "\rCliffs (left to right): [ " <<
      cliff_left <<
      ", " <<
      cliff_front_left <<
      ", " <<
      cliff_front_right <<
      ", " <<
      cliff_right <<
      " ]";

    usleep(10000);  // 10 Hz
  }

  return 0;
}